

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O3

void __thiscall CompilerStatistics::CompilerStatistics(CompilerStatistics *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x18;
  do {
    puVar1 = (undefined8 *)((long)(this->timers).little + lVar2 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->timers).little + lVar2 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(this->timers).little[0].keyName.end + lVar2) = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x298);
  (this->timers).allocator = (Allocator *)0x0;
  (this->timers).data = (this->timers).little;
  (this->timers).max = 0x10;
  this->startTime = 0;
  this->finishTime = 0;
  (this->timers).little[0].keyName.begin = "Lexer";
  (this->timers).little[0].keyName.end = "";
  (this->timers).little[0].outputName.begin = "lexer";
  (this->timers).little[0].outputName.end = "";
  (this->timers).little[0].total = 0;
  (this->timers).little[1].keyName.begin = "Parse";
  (this->timers).little[1].keyName.end = "";
  (this->timers).little[1].outputName.begin = "parse";
  (this->timers).little[1].outputName.end = "";
  (this->timers).little[1].total = 0;
  (this->timers).little[2].keyName.begin = "Import";
  (this->timers).little[2].keyName.end = "";
  (this->timers).little[2].outputName.begin = "import";
  (this->timers).little[2].outputName.end = "";
  (this->timers).little[2].total = 0;
  (this->timers).little[3].keyName.begin = "Expressions";
  (this->timers).little[3].keyName.end = "";
  (this->timers).little[3].outputName.begin = "analyze";
  (this->timers).little[3].outputName.end = "";
  (this->timers).little[3].total = 0;
  (this->timers).little[4].keyName.begin = "Finalization";
  (this->timers).little[4].keyName.end = "";
  (this->timers).little[4].outputName.begin = "(finalize)";
  (this->timers).little[4].outputName.end = "";
  (this->timers).little[4].total = 0;
  (this->timers).little[5].keyName.begin = "Cleanup";
  (this->timers).little[5].keyName.end = "";
  (this->timers).little[5].outputName.begin = "(cleanup)";
  (this->timers).little[5].outputName.end = "";
  (this->timers).little[5].total = 0;
  (this->timers).little[6].keyName.begin = "IrCodeGen";
  (this->timers).little[6].keyName.end = "";
  (this->timers).little[6].outputName.begin = "codegen";
  (this->timers).little[6].outputName.end = "";
  (this->timers).little[6].total = 0;
  (this->timers).little[7].keyName.begin = "LlvmCodeGen";
  (this->timers).little[7].keyName.end = "";
  (this->timers).little[7].outputName.begin = "llvm";
  (this->timers).little[7].outputName.end = "";
  (this->timers).little[7].total = 0;
  (this->timers).little[8].keyName.begin = "IrOptimization";
  (this->timers).little[8].keyName.end = "";
  (this->timers).little[8].outputName.begin = "optimization";
  (this->timers).little[8].outputName.end = "";
  (this->timers).little[8].total = 0;
  (this->timers).little[9].keyName.begin = "IrFinalization";
  (this->timers).little[9].keyName.end = "";
  (this->timers).little[9].outputName.begin = "(finalize)";
  (this->timers).little[9].outputName.end = "";
  (this->timers).little[9].total = 0;
  (this->timers).little[10].keyName.begin = "IrLowering";
  (this->timers).little[10].keyName.end = "";
  (this->timers).little[10].outputName.begin = "lower";
  (this->timers).little[10].outputName.end = "";
  (this->timers).little[10].total = 0;
  (this->timers).little[0xb].keyName.begin = "Bytecode";
  (this->timers).little[0xb].keyName.end = "";
  (this->timers).little[0xb].outputName.begin = "bytecode";
  (this->timers).little[0xb].outputName.end = "";
  (this->timers).little[0xb].total = 0;
  (this->timers).little[0xc].keyName.begin = "BytecodeCache";
  (this->timers).little[0xc].keyName.end = "";
  (this->timers).little[0xc].outputName.begin = "(cache)";
  (this->timers).little[0xc].outputName.end = "";
  (this->timers).little[0xc].total = 0;
  (this->timers).little[0xd].keyName.begin = "Logging";
  (this->timers).little[0xd].keyName.end = "";
  (this->timers).little[0xd].outputName.begin = "logs";
  (this->timers).little[0xd].outputName.end = "";
  (this->timers).little[0xd].total = 0;
  (this->timers).little[0xe].keyName.begin = "Tracing";
  (this->timers).little[0xe].keyName.end = "";
  (this->timers).little[0xe].outputName.begin = "trace";
  (this->timers).little[0xe].outputName.end = "";
  (this->timers).little[0xe].total = 0;
  (this->timers).count = 0x10;
  (this->timers).little[0xf].keyName.begin = "Extra";
  (this->timers).little[0xf].keyName.end = "";
  (this->timers).little[0xf].outputName.begin = "extra";
  (this->timers).little[0xf].outputName.end = "";
  (this->timers).little[0xf].total = 0;
  return;
}

Assistant:

CompilerStatistics()
	{
		startTime = 0;
		finishTime = 0;

		timers.push_back(Timer("Lexer", "lexer"));
		timers.push_back(Timer("Parse", "parse"));

		timers.push_back(Timer("Import", "import"));
		timers.push_back(Timer("Expressions", "analyze"));
		timers.push_back(Timer("Finalization", "(finalize)"));
		timers.push_back(Timer("Cleanup", "(cleanup)"));

		timers.push_back(Timer("IrCodeGen", "codegen"));
		timers.push_back(Timer("LlvmCodeGen", "llvm"));
		timers.push_back(Timer("IrOptimization", "optimization"));
		timers.push_back(Timer("IrFinalization", "(finalize)"));
		timers.push_back(Timer("IrLowering", "lower"));
		timers.push_back(Timer("Bytecode", "bytecode"));
		timers.push_back(Timer("BytecodeCache", "(cache)"));

		timers.push_back(Timer("Logging", "logs"));
		timers.push_back(Timer("Tracing", "trace"));
		timers.push_back(Timer("Extra", "extra"));
	}